

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMInteractionType.hpp
# Opt level: O0

void __thiscall
OpenMD::EAMInteractionType::EAMInteractionType
          (EAMInteractionType *this,RealType re,RealType alpha,RealType A,RealType Ci,RealType Cj)

{
  NonBondedInteractionType *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  _Base_ptr in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  NonBondedInteractionType *in_stack_ffffffffffffffb0;
  
  NonBondedInteractionType::NonBondedInteractionType(in_stack_ffffffffffffffb0);
  in_RDI->_vptr_NonBondedInteractionType = (_func_int **)&PTR__EAMInteractionType_0046a310;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x27df53);
  *(undefined4 *)&in_RDI[2].atomTypes_.first = 2;
  NonBondedInteractionType::setEAMOxides(in_RDI);
  *(undefined8 *)&in_RDI[1].properties_.propMap_._M_t._M_impl = in_XMM0_Qa;
  *(undefined8 *)&in_RDI[1].properties_.propMap_._M_t._M_impl.super__Rb_tree_header._M_header =
       in_XMM1_Qa;
  in_RDI[1].properties_.propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = in_XMM2_Qa;
  in_RDI[2].nbitp.is_LennardJones = (bool)(char)in_XMM3_Qa;
  in_RDI[2].nbitp.is_Morse = (bool)(char)((ulong)in_XMM3_Qa >> 8);
  in_RDI[2].nbitp.is_MAW = (bool)(char)((ulong)in_XMM3_Qa >> 0x10);
  in_RDI[2].nbitp.is_EAMTable = (bool)(char)((ulong)in_XMM3_Qa >> 0x18);
  in_RDI[2].nbitp.is_EAMZhou = (bool)(char)((ulong)in_XMM3_Qa >> 0x20);
  in_RDI[2].nbitp.is_EAMOxides = (bool)(char)((ulong)in_XMM3_Qa >> 0x28);
  in_RDI[2].nbitp.is_SC = (bool)(char)((ulong)in_XMM3_Qa >> 0x30);
  in_RDI[2].nbitp.is_RepulsivePower = (bool)(char)((ulong)in_XMM3_Qa >> 0x38);
  *(undefined8 *)&in_RDI[2].nbitp.is_Mie = in_XMM4_Qa;
  return;
}

Assistant:

EAMInteractionType(RealType re, RealType alpha, RealType A, RealType Ci,
                       RealType Cj) {
      interactionType_ = eamitOxides;
      setEAMOxides();
      re_    = re;
      alpha_ = alpha;
      A_     = A;
      Ci_    = Ci;
      Cj_    = Cj;
    }